

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlFdWrite(void *context,char *buffer,int len)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  
  iVar2 = *context;
  iVar5 = 0;
  while( true ) {
    if (len < 1) {
      return iVar5;
    }
    sVar3 = write(iVar2,buffer,(ulong)(uint)len);
    uVar1 = (uint)sVar3;
    if ((int)uVar1 < 0) break;
    iVar5 = iVar5 + uVar1;
    buffer = buffer + (uVar1 & 0x7fffffff);
    len = len - uVar1;
  }
  piVar4 = __errno_location();
  iVar2 = xmlIOErr(*piVar4);
  return -iVar2;
}

Assistant:

static int
xmlFdWrite(void *context, const char *buffer, int len) {
    xmlFdIOCtxt *fdctxt = context;
    int fd = fdctxt->fd;
    int ret = 0;
    int bytes;

    while (len > 0) {
	bytes = write(fd, buffer, len);
	if (bytes < 0)
            return(-xmlIOErr(errno));
        ret += bytes;
        buffer += bytes;
        len -= bytes;
    }

    return(ret);
}